

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O3

void ScaleRowDown34_1_Box_16_C(uint16_t *src_ptr,ptrdiff_t src_stride,uint16_t *d,int dst_width)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  long lVar7;
  uint16_t *s;
  ushort *puVar8;
  
  if (0 < dst_width) {
    puVar8 = src_ptr + 3;
    lVar7 = 0;
    do {
      uVar1 = puVar8[-2];
      uVar2 = puVar8[-1];
      uVar3 = *puVar8;
      uVar4 = puVar8[src_stride + -2];
      uVar5 = puVar8[src_stride + -1];
      uVar6 = puVar8[src_stride];
      d[lVar7] = (uint16_t)
                 (((uint)uVar1 + (uint)puVar8[-3] + (uint)puVar8[-3] * 2 + 2 >> 2) +
                  ((uint)puVar8[src_stride + -3] + (uint)puVar8[src_stride + -3] * 2 + (uint)uVar4 +
                   2 >> 2) + 1 >> 1);
      d[lVar7 + 1] = (uint16_t)
                     (((uint)uVar1 + (uint)uVar2 + 1 >> 1 & 0xffff) +
                      ((uint)uVar4 + (uint)uVar5 + 1 >> 1 & 0xffff) + 1 >> 1);
      d[lVar7 + 2] = (uint16_t)
                     (((uint)uVar3 + (uint)uVar3 * 2 + (uint)uVar2 + 2 >> 2) +
                      ((uint)uVar5 + (uint)uVar6 + (uint)uVar6 * 2 + 2 >> 2) + 1 >> 1);
      lVar7 = lVar7 + 3;
      puVar8 = puVar8 + 4;
    } while ((int)lVar7 < dst_width);
  }
  return;
}

Assistant:

void ScaleRowDown34_1_Box_16_C(const uint16_t* src_ptr,
                               ptrdiff_t src_stride,
                               uint16_t* d,
                               int dst_width) {
  const uint16_t* s = src_ptr;
  const uint16_t* t = src_ptr + src_stride;
  int x;
  assert((dst_width % 3 == 0) && (dst_width > 0));
  for (x = 0; x < dst_width; x += 3) {
    uint16_t a0 = (s[0] * 3 + s[1] * 1 + 2) >> 2;
    uint16_t a1 = (s[1] * 1 + s[2] * 1 + 1) >> 1;
    uint16_t a2 = (s[2] * 1 + s[3] * 3 + 2) >> 2;
    uint16_t b0 = (t[0] * 3 + t[1] * 1 + 2) >> 2;
    uint16_t b1 = (t[1] * 1 + t[2] * 1 + 1) >> 1;
    uint16_t b2 = (t[2] * 1 + t[3] * 3 + 2) >> 2;
    d[0] = (a0 + b0 + 1) >> 1;
    d[1] = (a1 + b1 + 1) >> 1;
    d[2] = (a2 + b2 + 1) >> 1;
    d += 3;
    s += 4;
    t += 4;
  }
}